

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_dependency_manager.cpp
# Opt level: O1

vector<duckdb::LogicalIndex,_true> * __thiscall
duckdb::ColumnDependencyManager::RemoveColumn
          (vector<duckdb::LogicalIndex,_true> *__return_storage_ptr__,ColumnDependencyManager *this,
          LogicalIndex index,idx_t column_amount)

{
  __node_gen_type __node_gen;
  LogicalIndex local_30;
  logical_index_set_t *local_28;
  
  local_28 = &this->deleted_columns;
  local_30.index = index.index;
  ::std::
  _Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<duckdb::LogicalIndex_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::LogicalIndex,true>>>>
            ((_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_28,&local_30);
  RemoveGeneratedColumn(this,local_30);
  RemoveStandardColumn(this,local_30);
  CleanupInternals(__return_storage_ptr__,this,column_amount);
  return __return_storage_ptr__;
}

Assistant:

vector<LogicalIndex> ColumnDependencyManager::RemoveColumn(LogicalIndex index, idx_t column_amount) {
	// Always add the initial column
	deleted_columns.insert(index);

	RemoveGeneratedColumn(index);
	RemoveStandardColumn(index);

	// Clean up the internal list
	vector<LogicalIndex> new_indices = CleanupInternals(column_amount);
	D_ASSERT(deleted_columns.empty());
	return new_indices;
}